

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

void __thiscall ON_Displacement::ON_Displacement(ON_Displacement *this,ON_XMLNode *dsp_node)

{
  ON_SimpleArray<ON_Displacement::SubItem_*> *this_00;
  bool bVar1;
  int iVar2;
  CImplDSP *this_01;
  undefined4 extraout_var;
  wchar_t *name;
  undefined4 extraout_var_00;
  SubItem *this_02;
  ON_XMLNode *pOVar3;
  SubItem *local_130;
  ON_XMLNode *local_128;
  ON_XMLNode *child_node;
  ChildIterator it;
  ON_XMLNode new_dsp_node;
  ON_XMLNode *dsp_node_local;
  ON_Displacement *this_local;
  
  ON_MeshModifier::ON_MeshModifier(&this->super_ON_MeshModifier);
  (this->super_ON_MeshModifier)._vptr_ON_MeshModifier = (_func_int **)&PTR__ON_Displacement_00b735d0
  ;
  this_01 = (CImplDSP *)operator_new(0x18);
  CImplDSP::CImplDSP(this_01);
  this->m_impl_dsp = this_01;
  iVar2 = (*dsp_node->_vptr_ON_XMLNode[3])();
  name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)CONCAT44(extraout_var,iVar2));
  ON_XMLNode::ON_XMLNode((ON_XMLNode *)&it._private,name);
  (*dsp_node->_vptr_ON_XMLNode[0x2c])(&child_node);
  while (local_128 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)&child_node),
        local_128 != (ON_XMLNode *)0x0) {
    iVar2 = (*local_128->_vptr_ON_XMLNode[3])();
    bVar1 = ::operator==(L"sub",(ON_wString *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      this_00 = &this->m_impl_dsp->m_subs;
      this_02 = (SubItem *)operator_new(8);
      SubItem::SubItem(this_02,local_128);
      local_130 = this_02;
      ON_SimpleArray<ON_Displacement::SubItem_*>::Append(this_00,&local_130);
    }
    else {
      pOVar3 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(pOVar3,local_128);
      ON_XMLNode::AttachChildNode((ON_XMLNode *)&it._private,pOVar3);
    }
  }
  pOVar3 = ON_InternalXMLImpl::Node
                     (&((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl);
  ON_XMLNode::operator=(pOVar3,(ON_XMLNode *)&it._private);
  ON_XMLNode::ChildIterator::~ChildIterator((ChildIterator *)&child_node);
  ON_XMLNode::~ON_XMLNode((ON_XMLNode *)&it._private);
  return;
}

Assistant:

ON_Displacement::ON_Displacement(const ON_XMLNode& dsp_node)
{
  m_impl_dsp = new CImplDSP;

  // Iterate over the displacement node looking at each child node's name. If the child
  // node is a sub-item node, create a sub-item object to hold the sub-item XML. Otherwise add
  // a copy of the child node to a new displacement node.
  ON_XMLNode new_dsp_node(dsp_node.TagName());

  auto it = dsp_node.GetChildIterator();
  while (ON_XMLNode* child_node = it.GetNextChild())
  {
    if (ON_DISPLACEMENT_SUB == child_node->TagName())
    {
      m_impl_dsp->m_subs.Append(new SubItem(*child_node));
    }
    else
    {
      new_dsp_node.AttachChildNode(new ON_XMLNode(*child_node));
    }
  }

  // Copy the new displacement node to our node. It only contains displacement XML with no sub-item nodes.
  m_impl->Node() = new_dsp_node;
}